

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockingqueue.hpp
# Opt level: O3

function<void_()> * __thiscall
BlockingQueue<std::function<void_()>_>::pop
          (function<void_()> *__return_storage_ptr__,BlockingQueue<std::function<void_()>_> *this)

{
  _Invoker_type p_Var1;
  _Manager_type p_Var2;
  ulong uVar3;
  _Elt_pointer pIVar4;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  _Manager_type local_48;
  _Invoker_type local_40;
  ulong local_38;
  
  local_68._M_owns = false;
  local_68._M_device = &this->mutex;
  std::unique_lock<std::mutex>::lock(&local_68);
  local_68._M_owns = true;
  pIVar4 = (this->items).c.
           super__Deque_base<BlockingQueue<std::function<void_()>_>::Item,_std::allocator<BlockingQueue<std::function<void_()>_>::Item>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->items).c.
      super__Deque_base<BlockingQueue<std::function<void_()>_>::Item,_std::allocator<BlockingQueue<std::function<void_()>_>::Item>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur == pIVar4) {
    do {
      std::condition_variable::wait((unique_lock *)&this->itemsNotEmpty);
      pIVar4 = (this->items).c.
               super__Deque_base<BlockingQueue<std::function<void_()>_>::Item,_std::allocator<BlockingQueue<std::function<void_()>_>::Item>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
    } while ((this->items).c.
             super__Deque_base<BlockingQueue<std::function<void_()>_>::Item,_std::allocator<BlockingQueue<std::function<void_()>_>::Item>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur == pIVar4);
  }
  local_58 = 0;
  uStack_50 = 0;
  local_48 = (_Manager_type)0x0;
  p_Var1 = (pIVar4->value)._M_invoker;
  p_Var2 = (pIVar4->value).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    local_58 = *(undefined8 *)&(pIVar4->value).super__Function_base._M_functor;
    uStack_50 = *(undefined8 *)((long)&(pIVar4->value).super__Function_base._M_functor + 8);
    (pIVar4->value).super__Function_base._M_manager = (_Manager_type)0x0;
    (pIVar4->value)._M_invoker = (_Invoker_type)0x0;
    local_48 = p_Var2;
  }
  uVar3 = pIVar4->size;
  local_40 = p_Var1;
  local_38 = uVar3;
  std::
  deque<BlockingQueue<std::function<void_()>_>::Item,_std::allocator<BlockingQueue<std::function<void_()>_>::Item>_>
  ::pop_front(&(this->items).c);
  if (uVar3 != 0) {
    if (this->totalSize < uVar3) {
      __assert_fail("totalSize >= item.size",
                    "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/src/blockingqueue.hpp"
                    ,0x2e,
                    "T BlockingQueue<std::function<void ()>>::pop() [T = std::function<void ()>]");
    }
    this->totalSize = this->totalSize - uVar3;
    std::unique_lock<std::mutex>::unlock(&local_68);
    std::condition_variable::notify_all();
  }
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = p_Var1;
  if (p_Var2 != (_Manager_type)0x0) {
    *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = local_58;
    *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) =
         uStack_50;
    (__return_storage_ptr__->super__Function_base)._M_manager = p_Var2;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_68);
  return __return_storage_ptr__;
}

Assistant:

T pop()
	{
		std::unique_lock<std::mutex> lock(mutex);

		itemsNotEmpty.wait(lock, [&]() { return !items.empty(); });

		Item item = std::move(items.front());
		items.pop();

		if (item.size > 0)
		{
			assert(totalSize >= item.size);
			totalSize -= item.size;

			lock.unlock();
			itemsNotFull.notify_all();
		}

		return std::move(item.value);
	}